

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_primitive_coerceASTNodeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  ulong valueExpression;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  valueExpression = arguments[1];
  if (((valueExpression & 0xf) != 0 || valueExpression == 0) ||
     (uVar4 = *(ulong *)(valueExpression + 0x20), uVar4 == 0)) {
    return valueExpression;
  }
  uVar2 = (context->roots).controlFlowEscapeType;
  if (((uVar2 != 0) && ((((uint)uVar2 | (uint)uVar4) & 0xf) == 0)) &&
     (uVar5 = uVar4, (*(byte *)(uVar4 + 8) & 0x80) == 0)) {
    do {
      if (uVar5 == uVar2) {
        return valueExpression;
      }
      puVar1 = (ulong *)(uVar5 + 0x30);
      uVar5 = *puVar1;
    } while (*puVar1 != 0);
  }
  if ((uVar4 & 0xf) != 0) {
LAB_0013dc5c:
    sysbvm_error("Cannot perform the node type coercion.");
  }
  if ((*(byte *)(uVar4 + 8) & 0x80) == 0) {
    uVar4 = *(ulong *)(uVar4 + 0x70);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar4 = (long)uVar4 >> 4;
    }
    else {
      uVar4 = *(ulong *)(uVar4 + 0x10);
    }
    if ((uVar4 & 0x40) == 0) goto LAB_0013dc5c;
  }
  sVar3 = sysbvm_astDownCastNode_addOntoNodeWithTargetType(context,valueExpression,*arguments);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_primitive_coerceASTNodeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_tuple_t *targetType = &arguments[0];
    sysbvm_tuple_t *astNode = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    (void)targetType;
    (void)environment;

    sysbvm_tuple_t sourceType = sysbvm_astNode_getAnalyzedType(*astNode);
    if(sourceType && !sysbvm_type_isDirectSubtypeOf(sourceType, context->roots.controlFlowEscapeType))
    {
        if(sysbvm_type_isDynamic(sourceType))
        {
            // Add a downcast for the untyped case.
            return sysbvm_astDownCastNode_addOntoNodeWithTargetType(context, *astNode, *targetType);
        }
        else
        {
            sysbvm_error("Cannot perform the node type coercion.");
        }
    }

    return *astNode;
}